

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VInvTest_Serial(N_Vector x,N_Vector z)

{
  double dVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar2 = *x->content;
  lVar3 = *(long *)((long)x->content + 8);
  uVar8 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar8;
  }
  lVar4 = *(long *)((long)z->content + 8);
  iVar6 = 1;
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    dVar1 = *(double *)(lVar3 + uVar8 * 8);
    if ((dVar1 != 0.0) || (iVar5 = 0, NAN(dVar1))) {
      *(double *)(lVar4 + uVar8 * 8) = 1.0 / dVar1;
      iVar5 = iVar6;
    }
    iVar6 = iVar5;
  }
  return iVar6;
}

Assistant:

booleantype N_VInvTest_Serial(N_Vector x, N_Vector z)
{
  sunindextype i, N;
  realtype *xd, *zd;
  booleantype no_zero_found;

  xd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  zd = NV_DATA_S(z);

  no_zero_found = SUNTRUE;
  for (i = 0; i < N; i++) {
    if (xd[i] == ZERO)
      no_zero_found = SUNFALSE;
    else
      zd[i] = ONE/xd[i];
  }

  return no_zero_found;
}